

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glib_compat.c
# Opt level: O1

gpointer g_hash_table_find(GHashTable *hash_table,GHRFunc predicate,gpointer user_data)

{
  GHashNode *pGVar1;
  bool bVar2;
  gboolean gVar3;
  long lVar4;
  long lVar5;
  gpointer local_40;
  
  if ((predicate != (GHRFunc)0x0 && hash_table != (GHashTable *)0x0) && (0 < hash_table->size)) {
    lVar5 = 0x10;
    lVar4 = 0;
    do {
      pGVar1 = hash_table->nodes;
      bVar2 = true;
      if ((1 < *(uint *)((long)&pGVar1->key + lVar5)) &&
         (gVar3 = (*predicate)(*(gpointer *)((long)pGVar1 + lVar5 + -0x10),
                               *(gpointer *)((long)pGVar1 + lVar5 + -8),user_data), gVar3 != 0)) {
        local_40 = *(gpointer *)((long)pGVar1 + lVar5 + -8);
        bVar2 = false;
      }
      if (!bVar2) {
        return local_40;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x18;
    } while (lVar4 < hash_table->size);
  }
  return (gpointer)0x0;
}

Assistant:

gpointer g_hash_table_find (GHashTable      *hash_table,
        GHRFunc          predicate,
        gpointer         user_data)
{
    gint i;

    if (hash_table == NULL) return NULL;
    if (predicate == NULL) return NULL;

    for (i = 0; i < hash_table->size; i++)
    {
        GHashNode *node = &hash_table->nodes [i];

        if (node->key_hash > 1 && predicate (node->key, node->value, user_data))
            return node->value;
    }

    return NULL;
}